

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O3

ostream * glu::operator<<(ostream *str,VariableDeclaration *decl)

{
  undefined4 in_EAX;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  DeclareVariable local_70;
  
  auVar5._0_4_ = -(uint)((decl->layout).location == -1);
  auVar5._4_4_ = -(uint)((decl->layout).binding == -1);
  auVar5._8_4_ = -(uint)((decl->layout).offset == -1);
  auVar5._12_4_ = -(uint)((decl->layout).format == FORMATLAYOUT_LAST);
  iVar1 = movmskps(in_EAX,auVar5);
  if ((iVar1 != 0xf) || ((decl->layout).matrixOrder != MATRIXORDER_LAST)) {
    operator<<(str,&decl->layout);
    std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
  }
  iVar1 = 0;
  uVar2 = 1;
  do {
    if ((decl->memoryAccessQualifierBits & uVar2) != 0) {
      pcVar4 = "coherent";
      switch(uVar2 & 0xff) {
      case 1:
        break;
      case 2:
        pcVar4 = "volatile";
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_00849c15_caseD_3:
        std::ios::clear((int)str + (int)*(undefined8 *)(*(long *)str + -0x18));
        goto LAB_00849c6d;
      case 4:
        pcVar4 = "restrict";
        break;
      case 8:
        pcVar4 = "readonly";
        break;
      default:
        if ((uVar2 & 0xff) != 0x10) goto switchD_00849c15_caseD_3;
        pcVar4 = "writeonly";
      }
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(str,pcVar4,sVar3);
LAB_00849c6d:
      std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
    }
    uVar2 = 2 << ((byte)iVar1 & 0x1f);
    iVar1 = iVar1 + 1;
    if (iVar1 == 5) {
      if ((long)(int)decl->interpolation != 3) {
        pcVar4 = getInterpolationName::s_names[(int)decl->interpolation];
        sVar3 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(str,pcVar4,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
      }
      if ((long)(int)decl->storage != 7) {
        pcVar4 = getStorageName::s_names[(int)decl->storage];
        sVar3 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(str,pcVar4,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(str," ",1);
      }
      glu::decl::DeclareVariable::DeclareVariable(&local_70,&decl->varType,&decl->name,0);
      glu::decl::operator<<(str,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p,
                        local_70.name.field_2._M_allocated_capacity + 1);
      }
      VarType::~VarType(&local_70.varType);
      return str;
    }
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& str, const VariableDeclaration& decl)
{
	if (decl.layout != Layout())
		str << decl.layout << " ";

	for (int bitNdx = 0; (1 << bitNdx) & MEMORYACCESSQUALIFIER_MASK; ++bitNdx)
		if (decl.memoryAccessQualifierBits & (1 << bitNdx))
			str << getMemoryAccessQualifierName((glu::MemoryAccessQualifier)(1 << bitNdx)) << " ";

	if (decl.interpolation != INTERPOLATION_LAST)
		str << getInterpolationName(decl.interpolation) << " ";

	if (decl.storage != STORAGE_LAST)
		str << getStorageName(decl.storage) << " ";

	str << declare(decl.varType, decl.name);

	return str;
}